

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void cutting_wire(tgestate_t *state)

{
  uint8_t *puVar1;
  
  if (state->player_locked_out_until == state->game_counter) {
    puVar1 = &state->vischars[0].direction;
    *puVar1 = *puVar1 & 3;
    state->vischars[0].input = 0x80;
    state->vischars[0].mi.mappos.w = 0x18;
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xfc;
  }
  else if ((uint)state->player_locked_out_until - (uint)state->game_counter < 4) {
    state->vischars[0].input = cutting_wire::new_inputs[state->vischars[0].direction & 3];
    return;
  }
  return;
}

Assistant:

void cutting_wire(tgestate_t *state)
{
  /**
   * $9EE0: New inputs table.
   */
  static const uint8_t new_inputs[4] =
  {
    input_UP   + input_LEFT  + input_KICK,
    input_UP   + input_RIGHT + input_KICK,
    input_DOWN + input_RIGHT + input_KICK,
    input_DOWN + input_LEFT  + input_KICK
  };

  vischar_t   *hero = &state->vischars[0]; /* new, for conciseness */
  unsigned int delta; /* was A */

  assert(state != NULL);

  delta = state->player_locked_out_until - state->game_counter;
  if (delta)
  {
    if (delta < 4)
      hero->input = new_inputs[hero->direction & vischar_DIRECTION_MASK];
  }
  else
  {
    /* Countdown reached: Break through the fence. */
    /* BUG FIX: The original game neglects to fetch hero->direction here and
     * uses 'delta' instead as the direction. delta is always zero here, so
     * 'hero->direction' gets set to zero too. Thus the hero will always face
     * top-left (direction_TOP_LEFT == 0) after breaking through a fence.
     * We fix that here. */
    hero->direction = hero->direction & vischar_DIRECTION_MASK;
    hero->input = input_KICK;
    hero->mi.mappos.w = 24;

    /* Conv: The original code jumps into the tail end of picking_lock()
     * above to do this. */
    hero->flags &= ~(vischar_FLAGS_PICKING_LOCK | vischar_FLAGS_CUTTING_WIRE);
  }
}